

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cortex_unpack.cpp
# Opt level: O3

int Unpack_UnnamedMarkers(char **pptr,sFrameOfData *Frame)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  tMarkerData *__dest;
  
  piVar2 = (int *)*pptr;
  iVar1 = *piVar2;
  iVar3 = iVar1 * 0xc;
  if (iVar1 == Frame->nUnidentifiedMarkers) {
    __dest = Frame->UnidentifiedMarkers;
  }
  else {
    Frame->nUnidentifiedMarkers = iVar1;
    __dest = (tMarkerData *)realloc(Frame->UnidentifiedMarkers,(long)iVar3);
    Frame->UnidentifiedMarkers = __dest;
  }
  memcpy(__dest,piVar2 + 1,(long)iVar3);
  *pptr = (char *)((long)piVar2 + (long)iVar3 + 4U);
  return iVar3 + 4;
}

Assistant:

int Unpack_UnnamedMarkers(char **pptr, sFrameOfData *Frame)
{
  char *ptr = *pptr;
  int nBytes = 0;
  int nTotalBytes = 0;
  int nMarkers;

  memcpy(&nMarkers, ptr, 4);
  ptr += 4;
  nTotalBytes += 4;

  nBytes = nMarkers * sizeof(tMarkerData);

  if (nMarkers != Frame->nUnidentifiedMarkers) {
    Frame->nUnidentifiedMarkers = nMarkers;
    Frame->UnidentifiedMarkers
        = (tMarkerData*) realloc(Frame->UnidentifiedMarkers, nBytes);
  }

  memcpy(Frame->UnidentifiedMarkers, ptr, nBytes);
  ptr += nBytes;
  nTotalBytes += nBytes;

  *pptr = ptr;
  return nTotalBytes;
}